

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::read_symlink(path *__return_storage_ptr__,path *p,error_code *ec)

{
  error_category *peVar1;
  path result;
  file_status fs;
  path pStack_48;
  int local_28 [2];
  
  symlink_status((filesystem *)local_28,p,ec);
  if (local_28[0] == 4) {
    detail::resolveSymlink(&pStack_48,p,ec);
    if (ec->_M_value == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pStack_48);
    }
    else {
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    }
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  else {
    peVar1 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0x16;
    ec->_M_cat = peVar1;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path read_symlink(const path& p, std::error_code& ec)
{
    file_status fs = symlink_status(p, ec);
    if (fs.type() != file_type::symlink) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return path();
    }
    auto result = detail::resolveSymlink(p, ec);
    return ec ? path() : result;
}